

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O1

Symbol __thiscall avro::parsing::Symbol::rootSymbol(Symbol *this,ProductionPtr *s)

{
  element_type *peVar1;
  placeholder *ppVar2;
  any extraout_RDX;
  Symbol SVar3;
  placeholder local_50;
  _func_int **local_48;
  placeholder local_40;
  _func_int **local_38;
  shared_count local_30;
  
  boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
  peVar1 = s->px;
  local_50._vptr_placeholder = (_func_int **)(s->pn).pi_;
  if ((sp_counted_base *)local_50._vptr_placeholder != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_50._vptr_placeholder)->use_count_ =
         ((sp_counted_base *)local_50._vptr_placeholder)->use_count_ + 1;
    UNLOCK();
  }
  local_48 = local_38;
  local_40._vptr_placeholder = (_func_int **)local_30.pi_;
  if (local_30.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_30.pi_)->use_count_ = (local_30.pi_)->use_count_ + 1;
    UNLOCK();
  }
  this->kind_ = sRoot;
  ppVar2 = (placeholder *)operator_new(0x28);
  ppVar2->_vptr_placeholder = (_func_int **)&PTR__holder_00193938;
  ppVar2[1]._vptr_placeholder = (_func_int **)peVar1;
  ppVar2[2]._vptr_placeholder = local_50._vptr_placeholder;
  if ((sp_counted_base *)local_50._vptr_placeholder != (sp_counted_base *)0x0) {
    LOCK();
    *(uint_least32_t *)(local_50._vptr_placeholder + 1) =
         *(uint_least32_t *)(local_50._vptr_placeholder + 1) + 1;
    UNLOCK();
  }
  ppVar2[3]._vptr_placeholder = local_48;
  ppVar2[4]._vptr_placeholder = local_40._vptr_placeholder;
  if (local_40._vptr_placeholder != (_func_int **)0x0) {
    LOCK();
    *(int *)(local_40._vptr_placeholder + 1) = *(int *)(local_40._vptr_placeholder + 1) + 1;
    UNLOCK();
  }
  (this->extra_).content = ppVar2;
  boost::detail::shared_count::~shared_count((shared_count *)&local_40);
  boost::detail::shared_count::~shared_count((shared_count *)&local_50);
  boost::detail::shared_count::~shared_count(&local_30);
  SVar3.extra_.content = extraout_RDX.content;
  SVar3._0_8_ = this;
  return SVar3;
}

Assistant:

static Symbol rootSymbol(ProductionPtr& s)
    {
        return Symbol(Symbol::sRoot, RootInfo(s, boost::make_shared<Production>()));
    }